

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

Float pbrt::SampleTent(Float u,Float radius)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 local_30;
  Float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 local_18 [16];
  
  auVar11._8_4_ = 0x3f000000;
  auVar11._0_8_ = 0x3f0000003f000000;
  auVar11._12_4_ = 0x3f000000;
  lVar3 = 0;
  local_30 = vmovlps_avx(auVar11);
  do {
    fVar4 = *(float *)((long)&local_30 + lVar3 * 4);
    if (u < fVar4) goto LAB_003f1259;
    u = u - fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  lVar3 = 2;
LAB_003f1259:
  local_28 = radius;
  uStack_24 = in_XMM1_Db;
  uStack_20 = in_XMM1_Dc;
  uStack_1c = in_XMM1_Dd;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg)
     , iVar2 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
  if (lVar3 == 2) {
    *(long *)(in_FS_OFFSET + -0x338) = *(long *)(in_FS_OFFSET + -0x338) + 1;
    auVar6._0_4_ = u / local_30._4_4_;
    auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar6);
  }
  else {
    auVar7._0_4_ = u / *(float *)((long)&local_30 + (long)(int)lVar3 * 4);
    auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
    if ((int)lVar3 == 0) {
      auVar10._4_4_ = uStack_24;
      auVar10._0_4_ = local_28;
      auVar10._8_4_ = uStack_20;
      auVar10._12_4_ = uStack_1c;
      auVar7 = ZEXT816(0);
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      local_18 = vxorps_avx512vl(auVar10,auVar1);
      fVar4 = auVar11._0_4_;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar4)),ZEXT816(0) << 0x20,auVar11);
        if (auVar7._0_4_ < 0.0) {
          fVar5 = sqrtf(auVar7._0_4_);
          auVar11 = ZEXT416((uint)fVar4);
        }
        else {
          auVar7 = vsqrtss_avx(auVar7,auVar7);
          fVar5 = auVar7._0_4_;
        }
        auVar10._4_4_ = uStack_24;
        auVar10._0_4_ = local_28;
        auVar10._8_4_ = uStack_20;
        auVar10._12_4_ = uStack_1c;
        auVar9._0_4_ = auVar11._0_4_ / (fVar5 + 0.0);
        auVar9._4_12_ = auVar11._4_12_;
        auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar9);
      }
      auVar11 = vfmadd213ss_fma(auVar7,auVar10,local_18);
      return auVar11._0_4_;
    }
  }
  fVar5 = auVar11._0_4_;
  fVar4 = (1.0 - fVar5) + fVar5 * 0.0;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
    auVar11 = ZEXT416((uint)fVar5);
  }
  else {
    auVar7 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar4 = auVar7._0_4_;
  }
  auVar8._0_4_ = auVar11._0_4_ / (fVar4 + 1.0);
  auVar8._4_12_ = auVar11._4_12_;
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar8);
  return auVar11._0_4_ * local_28;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleTent(Float u, Float radius) {
    if (SampleDiscrete({0.5f, 0.5f}, u, nullptr, &u) == 0)
        return -radius + radius * SampleLinear(u, 0, 1);
    else
        return radius * SampleLinear(u, 1, 0);
}